

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<wchar_t> *spec,hex_writer f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::hex_writer>
  f_00;
  alignment aVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  undefined4 uStack_74;
  undefined4 uStack_5c;
  undefined1 local_54 [8];
  align_spec as;
  size_t padding;
  ulong uStack_38;
  char_type fill;
  size_t size;
  basic_format_specs<wchar_t> *spec_local;
  uint num_digits_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  string_view prefix_local;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                *)prefix.data_;
  sVar4 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  uStack_38 = sVar4 + num_digits;
  padding._4_4_ = align_spec::fill(&spec->super_align_spec);
  as.fill_ = L'\0';
  as.align_ = ALIGN_DEFAULT;
  aVar1 = align_spec::align(&spec->super_align_spec);
  if (aVar1 == ALIGN_NUMERIC) {
    uVar2 = align_spec::width(&spec->super_align_spec);
    if (uStack_38 < uVar2) {
      uVar2 = align_spec::width(&spec->super_align_spec);
      as._4_8_ = uVar2 - uStack_38;
      uVar2 = align_spec::width(&spec->super_align_spec);
      uStack_38 = (ulong)uVar2;
    }
  }
  else {
    iVar3 = basic_format_specs<wchar_t>::precision(spec);
    if ((int)num_digits < iVar3) {
      sVar4 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
      iVar3 = basic_format_specs<wchar_t>::precision(spec);
      uStack_38 = sVar4 + (long)iVar3;
      iVar3 = basic_format_specs<wchar_t>::precision(spec);
      as._4_8_ = (long)iVar3 - (ulong)num_digits;
      padding._4_4_ = L'0';
    }
  }
  local_54._0_4_ = (spec->super_align_spec).width_;
  local_54._4_4_ = (spec->super_align_spec).fill_;
  as.width_ = (spec->super_align_spec).align_;
  aVar1 = align_spec::align(&spec->super_align_spec);
  if (aVar1 == ALIGN_DEFAULT) {
    as.width_ = 2;
  }
  f_00._20_4_ = uStack_74;
  f_00.fill = padding._4_4_;
  f_00.f._12_4_ = uStack_5c;
  f_00.f.num_digits = f.num_digits;
  f_00.prefix.size_ = (size_t)prefix_local.data_;
  f_00.prefix.data_ = (char *)this_local;
  f_00.padding._0_4_ = as.fill_;
  f_00.padding._4_4_ = as.align_;
  f_00.f.self = f.self;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>>
            (this,uStack_38,(align_spec *)local_54,f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }